

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Extension *local_28;
  Extension *extension;
  int default_value_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._0_4_ = default_value;
  extension._4_4_ = number;
  _default_value_local = this;
  local_28 = FindOrNull(this,number);
  if ((local_28 == (Extension *)0x0) || ((local_28->field_0xa & 1) != 0)) {
    this_local._4_4_ = (int)extension;
  }
  else {
    local_61 = 0;
    if ((local_28->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1e8);
      local_61 = 1;
      pLVar2 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(local_75,pLVar2);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    CVar1 = anon_unknown_22::cpp_type(local_28->type);
    local_b1 = 0;
    if (CVar1 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1e8);
      local_b1 = 1;
      pLVar2 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_b2,pLVar2);
    }
    if ((local_b1 & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    this_local._4_4_ = (local_28->field_0).enum_value;
  }
  return this_local._4_4_;
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}